

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O0

int bcache_write_partial
              (filemgr *file,bid_t bid,void *buf,size_t offset,size_t len,bool final_write)

{
  byte bVar1;
  __pointer_type node;
  hash_elem *phVar2;
  avl_node **item_00;
  undefined8 *puVar3;
  long in_RCX;
  void *in_RDX;
  hash_elem *e;
  avl_tree *in_RSI;
  size_t in_R8;
  byte in_R9B;
  dirty_item *ditem;
  uint8_t marker;
  size_t shard_num;
  timeval tp;
  fnamedic_item *fname_new;
  bcache_item query;
  bcache_item *item;
  hash_elem *h;
  uint64_t in_stack_ffffffffffffff48;
  memory_order mVar4;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  char cVar5;
  hash *in_stack_ffffffffffffff60;
  avl_cmp_func *in_stack_ffffffffffffff68;
  int local_4;
  
  node = std::atomic::operator_cast_to_fnamedic_item_((atomic<fnamedic_item_*> *)0x10978f);
  if (node == (__pointer_type)0x0) {
    pthread_spin_lock(&bcache_lock);
    node = std::atomic::operator_cast_to_fnamedic_item_((atomic<fnamedic_item_*> *)0x1097bc);
    if (node == (__pointer_type)0x0) {
      node = _fname_create((filemgr *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50))
      ;
    }
    pthread_spin_unlock(&bcache_lock);
  }
  gettimeofday((timeval *)&stack0xffffffffffffff60,(__timezone_ptr_t)0x0);
  atomic_store_uint64_t
            ((atomic<unsigned_long> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff48,memory_order_relaxed);
  mVar4 = (memory_order)(in_stack_ffffffffffffff48 >> 0x20);
  e = (hash_elem *)((ulong)in_RSI % node->num_shards);
  pthread_spin_lock(&node->shards[(long)e].lock);
  phVar2 = hash_find(in_stack_ffffffffffffff60,e);
  if (phVar2 == (hash_elem *)0x0) {
    pthread_spin_unlock(&node->shards[(long)e].lock);
    local_4 = 0;
  }
  else {
    item_00 = &phVar2[-1].avl.left;
    bVar1 = std::__atomic_base::operator_cast_to_unsigned_char((__atomic_base<unsigned_char> *)e);
    if ((bVar1 & 4) == 0) {
      bVar1 = std::__atomic_base::operator_cast_to_unsigned_char((__atomic_base<unsigned_char> *)e);
      if ((bVar1 & 1) == 0) {
        list_remove(&node->shards[(long)e].cleanlist,(list_elem *)(phVar2 + 1));
        puVar3 = (undefined8 *)malloc(0x20);
        *puVar3 = item_00;
        cVar5 = *(char *)((long)phVar2[-1].avl.right + (long)bcache_blocksize + -1);
        if (cVar5 == -1) {
          avl_insert(in_RSI,(avl_node *)node,in_stack_ffffffffffffff68);
        }
        else {
          avl_insert(in_RSI,(avl_node *)node,in_stack_ffffffffffffff68);
          mVar4 = (memory_order)((ulong)puVar3 >> 0x20);
          if ((in_R9B & 1) != 0) {
            std::__atomic_base<unsigned_char>::operator|=
                      ((__atomic_base<unsigned_char> *)&phVar2[1].avl.right,'\x02');
            atomic_incr_uint64_t
                      ((atomic<unsigned_long> *)CONCAT17(cVar5,in_stack_ffffffffffffff50),mVar4);
          }
        }
      }
      else {
        bVar1 = std::__atomic_base::operator_cast_to_unsigned_char
                          ((__atomic_base<unsigned_char> *)e);
        if (((bVar1 & 2) == 0) && ((in_R9B & 1) != 0)) {
          std::__atomic_base<unsigned_char>::operator|=
                    ((__atomic_base<unsigned_char> *)&phVar2[1].avl.right,'\x02');
          atomic_incr_uint64_t
                    ((atomic<unsigned_long> *)
                     CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),mVar4);
        }
      }
      std::__atomic_base<unsigned_char>::operator|=
                ((__atomic_base<unsigned_char> *)&phVar2[1].avl.right,'\x01');
      memcpy((void *)((long)&(phVar2[-1].avl.right)->parent + in_RCX),in_RDX,in_R8);
      _bcache_set_score((bcache_item *)item_00);
      pthread_spin_unlock(&node->shards[(long)e].lock);
      local_4 = (int)in_R8;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int bcache_write_partial(struct filemgr *file,
                         bid_t bid,
                         void *buf,
                         size_t offset,
                         size_t len,
                         bool final_write)
{
    struct hash_elem *h;
    struct bcache_item *item;
    struct bcache_item query;
    struct fnamedic_item *fname_new;

    fname_new = file->bcache;
    if (fname_new == NULL) {
        spin_lock(&bcache_lock);
        fname_new = file->bcache;
        if (fname_new == NULL) {
            // filename doesn't exist in filename dictionary .. create
            fname_new = _fname_create(file);
        }
        spin_unlock(&bcache_lock);
    }

    // Update the access timestamp.
    struct timeval tp;
    gettimeofday(&tp, NULL);
    atomic_store_uint64_t(&fname_new->access_timestamp,
                          (uint64_t) (tp.tv_sec * 1000000 + tp.tv_usec),
                          std::memory_order_relaxed);

    size_t shard_num = bid % fname_new->num_shards;
    // set query
    query.bid = bid;

    spin_lock(&fname_new->shards[shard_num].lock);

    // search hash table
    h = hash_find(&fname_new->shards[shard_num].hashtable, &query.hash_elem);
    if (h == NULL) {
        // cache miss .. partial write fail .. return 0
        spin_unlock(&fname_new->shards[shard_num].lock);
        return 0;

    } else {
        // cache hit .. get the block
        item = _get_entry(h, struct bcache_item, hash_elem);
    }

    if (item->flag & BCACHE_FREE) {
        DBG("Warning: failed to write on the buffer cache entry for a file '%s' "
            "because the entry belongs to the free list!\n",
            file->filename);
        return 0;
    }

    // check whether this is dirty block
    // to avoid re-insert already existing item into tree
    if (!(item->flag & BCACHE_DIRTY)) {
        // this block was clean block
        uint8_t marker;
        struct dirty_item *ditem;

        // remove from clean list
        list_remove(&fname_new->shards[shard_num].cleanlist, &item->list_elem);

        ditem = (struct dirty_item *)mempool_alloc(sizeof(struct dirty_item));
        ditem->item = item;

        // insert into tree
        marker = *((uint8_t*)item->addr + bcache_blocksize-1);
        if (marker == BLK_MARKER_BNODE ) {
            // b-tree node
            avl_insert(&fname_new->shards[shard_num].tree_idx, &ditem->avl, _dirty_cmp);
        } else {
            avl_insert(&fname_new->shards[shard_num].tree, &ditem->avl,
                       _dirty_cmp);
            if (final_write) {
                item->flag |= BCACHE_IMMUTABLE; // (fully written doc block)
                atomic_incr_uint64_t(&fname_new->nimmutable);
            }
        }
    } else if (!(item->flag & BCACHE_IMMUTABLE)) {
        if (final_write) {
            item->flag |= BCACHE_IMMUTABLE; // (fully written doc block)
            atomic_incr_uint64_t(&fname_new->nimmutable);
        }
    }

    // always set this block as dirty
    item->flag |= BCACHE_DIRTY;

    memcpy((uint8_t *)(item->addr) + offset, buf, len);
    _bcache_set_score(item);

    spin_unlock(&fname_new->shards[shard_num].lock);

    return len;
}